

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O2

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::CheckType
          (UpgradeMemoryModel *this,uint32_t type_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  Op opcode;
  bool bVar1;
  pair<bool,_bool> pVar2;
  uint32_t uVar3;
  int32_t iVar4;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  const_reference pvVar7;
  Instruction *index_inst;
  uint64_t uVar8;
  byte bVar9;
  ulong uVar10;
  ushort uVar11;
  
  pDVar5 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  pIVar6 = analysis::DefUseManager::GetDef(pDVar5,type_id);
  if (pIVar6->opcode_ != OpTypePointer) {
    __assert_fail("type_inst->opcode() == spv::Op::OpTypePointer",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                  ,0x19b,
                  "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                 );
  }
  pDVar5 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  uVar3 = Instruction::GetSingleWordInOperand(pIVar6,1);
  pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar3);
  uVar10 = (ulong)((long)(indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
  bVar9 = 0;
  uVar11 = 0;
  while( true ) {
    if ((int)uVar10 < 1) break;
    if ((uVar11 != 0) && (bVar9 != 0)) goto LAB_00475d93;
    opcode = pIVar6->opcode_;
    if (opcode == OpTypePointer) {
      uVar3 = 1;
    }
    else if (opcode == OpTypeStruct) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (indices,(ulong)((int)uVar10 - 1));
      uVar3 = *pvVar7;
      pDVar5 = IRContext::get_def_use_mgr((this->super_Pass).context_);
      index_inst = analysis::DefUseManager::GetDef(pDVar5,uVar3);
      if (index_inst->opcode_ != OpConstant) {
        __assert_fail("index_inst->opcode() == spv::Op::OpConstant",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                      ,0x1a7,
                      "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                     );
      }
      uVar8 = GetIndexValue(this,index_inst);
      uVar3 = (uint32_t)uVar8;
      bVar1 = HasDecoration(this,pIVar6,uVar3,Coherent);
      uVar11 = (ushort)(byte)((byte)uVar11 | bVar1);
      bVar1 = HasDecoration(this,pIVar6,uVar3,DecorationVolatile);
      bVar9 = bVar9 | bVar1;
    }
    else {
      iVar4 = spvOpcodeIsComposite(opcode);
      uVar3 = 0;
      if (iVar4 == 0) {
        __assert_fail("spvOpcodeIsComposite(element_inst->opcode())",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                      ,0x1b0,
                      "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                     );
      }
    }
    pDVar5 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    uVar3 = Instruction::GetSingleWordInOperand(pIVar6,uVar3);
    pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar3);
    uVar10 = uVar10 - 1;
  }
  if (uVar11 != 0) {
LAB_00475d93:
    if (bVar9 != 0) goto LAB_00475db7;
  }
  pVar2 = CheckAllTypes(this,pIVar6);
  uVar11 = (ushort)(byte)((byte)uVar11 | pVar2.first);
  bVar9 = bVar9 | pVar2.second;
LAB_00475db7:
  return (pair<bool,_bool>)(uVar11 | (ushort)bVar9 << 8);
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::CheckType(
    uint32_t type_id, const std::vector<uint32_t>& indices) {
  bool is_coherent = false;
  bool is_volatile = false;
  Instruction* type_inst = context()->get_def_use_mgr()->GetDef(type_id);
  assert(type_inst->opcode() == spv::Op::OpTypePointer);
  Instruction* element_inst = context()->get_def_use_mgr()->GetDef(
      type_inst->GetSingleWordInOperand(1u));
  for (int i = (int)indices.size() - 1; i >= 0; --i) {
    if (is_coherent && is_volatile) break;

    if (element_inst->opcode() == spv::Op::OpTypePointer) {
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(1u));
    } else if (element_inst->opcode() == spv::Op::OpTypeStruct) {
      uint32_t index = indices.at(i);
      Instruction* index_inst = context()->get_def_use_mgr()->GetDef(index);
      assert(index_inst->opcode() == spv::Op::OpConstant);
      uint64_t value = GetIndexValue(index_inst);
      is_coherent |= HasDecoration(element_inst, static_cast<uint32_t>(value),
                                   spv::Decoration::Coherent);
      is_volatile |= HasDecoration(element_inst, static_cast<uint32_t>(value),
                                   spv::Decoration::Volatile);
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(static_cast<uint32_t>(value)));
    } else {
      assert(spvOpcodeIsComposite(element_inst->opcode()));
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(0u));
    }
  }

  if (!is_coherent || !is_volatile) {
    bool remaining_coherent = false;
    bool remaining_volatile = false;
    std::tie(remaining_coherent, remaining_volatile) =
        CheckAllTypes(element_inst);
    is_coherent |= remaining_coherent;
    is_volatile |= remaining_volatile;
  }

  return std::make_pair(is_coherent, is_volatile);
}